

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.hpp
# Opt level: O3

void __thiscall schema::ColumnBase::~ColumnBase(ColumnBase *this)

{
  pointer pcVar1;
  
  this->_vptr_ColumnBase = (_func_int **)&PTR__ColumnBase_0020f048;
  pcVar1 = (this->binding)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->binding).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->bName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->bName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->sqlType)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->sqlType).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~ColumnBase() = default;